

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rrRenderer.cpp
# Opt level: O1

void rr::anon_unknown_19::cliputil::clipTriangleOneVertex
               (vector<rr::(anonymous_namespace)::cliputil::TriangleVertex,_std::allocator<rr::(anonymous_namespace)::cliputil::TriangleVertex>_>
                *clippedEdges,ClipVolumePlane *plane,TriangleVertex *clipped,TriangleVertex *v1,
               TriangleVertex *v2)

{
  double dVar1;
  int i;
  long lVar2;
  TriangleVertex *pTVar3;
  TriangleVertex *inside;
  TriangleVertex *outside;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Da_00;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  double dVar4;
  ClipVec4 approximatedClipPoint;
  TriangleVertex mid1;
  ClipVec4 anotherPointOnLine;
  TriangleVertex mid2;
  double local_f8 [5];
  double local_d0;
  value_type local_c8;
  undefined4 local_88;
  undefined4 uStack_84;
  undefined4 uStack_80;
  undefined4 uStack_7c;
  undefined4 local_78;
  undefined4 uStack_74;
  undefined4 uStack_70;
  undefined4 uStack_6c;
  value_type local_68;
  
  local_c8.position.m_data[2] = 0.0;
  local_c8.position.m_data[3] = 0.0;
  local_c8.position.m_data[0] = 0.0;
  local_c8.position.m_data[1] = 0.0;
  local_68.position.m_data[2] = 0.0;
  local_68.position.m_data[3] = 0.0;
  local_68.position.m_data[0] = 0.0;
  local_68.position.m_data[1] = 0.0;
  (*plane->_vptr_ClipVolumePlane[1])(plane,v1);
  dVar1 = (double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da);
  if ((double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da) < 1.0) {
    local_f8[2] = 0.0;
    local_f8[3] = 0.0;
    local_f8[0] = 0.0;
    local_f8[1] = 0.0;
    dVar4 = 1.0 - (double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da);
    lVar2 = 0;
    do {
      local_f8[lVar2] =
           (v1->position).m_data[lVar2] * dVar4 +
           (clipped->position).m_data[lVar2] * (double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da);
      lVar2 = lVar2 + 1;
    } while (lVar2 != 4);
    pTVar3 = clipped;
    if (0.5 <= (double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da) &&
        (double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da) != 0.5) {
      pTVar3 = v1;
    }
    local_88 = *(undefined4 *)(pTVar3->position).m_data;
    uStack_84 = *(undefined4 *)((long)(pTVar3->position).m_data + 4);
    uStack_80 = *(undefined4 *)((pTVar3->position).m_data + 1);
    uStack_7c = *(undefined4 *)((long)(pTVar3->position).m_data + 0xc);
    local_78 = *(undefined4 *)((pTVar3->position).m_data + 2);
    uStack_74 = *(undefined4 *)((long)(pTVar3->position).m_data + 0x14);
    uStack_70 = *(undefined4 *)((pTVar3->position).m_data + 3);
    uStack_6c = *(undefined4 *)((long)(pTVar3->position).m_data + 0x1c);
    (*plane->_vptr_ClipVolumePlane[2])(&local_c8,plane,local_f8);
    local_c8.weight[0] = v1->weight[0] * dVar4 + clipped->weight[0] * dVar1;
    local_c8.weight[1] = v1->weight[1] * dVar4 + clipped->weight[1] * dVar1;
    local_c8.weight[2] = dVar4 * v1->weight[2] + clipped->weight[2] * dVar1;
  }
  (*plane->_vptr_ClipVolumePlane[1])(plane,v2,clipped);
  if ((double)CONCAT44(extraout_XMM0_Db_00,extraout_XMM0_Da_00) < 1.0) {
    local_f8[2] = 0.0;
    local_f8[3] = 0.0;
    local_f8[0] = 0.0;
    local_f8[1] = 0.0;
    dVar4 = 1.0 - (double)CONCAT44(extraout_XMM0_Db_00,extraout_XMM0_Da_00);
    lVar2 = 0;
    do {
      local_f8[lVar2] =
           (v2->position).m_data[lVar2] * dVar4 +
           (clipped->position).m_data[lVar2] *
           (double)CONCAT44(extraout_XMM0_Db_00,extraout_XMM0_Da_00);
      lVar2 = lVar2 + 1;
    } while (lVar2 != 4);
    pTVar3 = clipped;
    if (0.5 <= (double)CONCAT44(extraout_XMM0_Db_00,extraout_XMM0_Da_00) &&
        (double)CONCAT44(extraout_XMM0_Db_00,extraout_XMM0_Da_00) != 0.5) {
      pTVar3 = v2;
    }
    local_88 = *(undefined4 *)(pTVar3->position).m_data;
    uStack_84 = *(undefined4 *)((long)(pTVar3->position).m_data + 4);
    uStack_80 = *(undefined4 *)((pTVar3->position).m_data + 1);
    uStack_7c = *(undefined4 *)((long)(pTVar3->position).m_data + 0xc);
    local_78 = *(undefined4 *)((pTVar3->position).m_data + 2);
    uStack_74 = *(undefined4 *)((long)(pTVar3->position).m_data + 0x14);
    uStack_70 = *(undefined4 *)((pTVar3->position).m_data + 3);
    uStack_6c = *(undefined4 *)((long)(pTVar3->position).m_data + 0x1c);
    local_d0 = (double)CONCAT44(extraout_XMM0_Db_00,extraout_XMM0_Da_00);
    (*plane->_vptr_ClipVolumePlane[2])(&local_68,plane,local_f8);
    local_68.weight[0] = v2->weight[0] * dVar4 + clipped->weight[0] * local_d0;
    local_68.weight[1] = v2->weight[1] * dVar4 + clipped->weight[1] * local_d0;
    local_68.weight[2] = dVar4 * v2->weight[2] + clipped->weight[2] * local_d0;
    if (dVar1 < 1.0) {
      std::
      vector<rr::(anonymous_namespace)::cliputil::TriangleVertex,_std::allocator<rr::(anonymous_namespace)::cliputil::TriangleVertex>_>
      ::push_back(clippedEdges,v1);
      v1 = &local_c8;
      clipped = &local_68;
    }
  }
  std::
  vector<rr::(anonymous_namespace)::cliputil::TriangleVertex,_std::allocator<rr::(anonymous_namespace)::cliputil::TriangleVertex>_>
  ::push_back(clippedEdges,v1);
  std::
  vector<rr::(anonymous_namespace)::cliputil::TriangleVertex,_std::allocator<rr::(anonymous_namespace)::cliputil::TriangleVertex>_>
  ::push_back(clippedEdges,clipped);
  std::
  vector<rr::(anonymous_namespace)::cliputil::TriangleVertex,_std::allocator<rr::(anonymous_namespace)::cliputil::TriangleVertex>_>
  ::push_back(clippedEdges,v2);
  return;
}

Assistant:

void clipTriangleOneVertex (std::vector<TriangleVertex>& clippedEdges, const ClipVolumePlane& plane, const TriangleVertex& clipped, const TriangleVertex& v1, const TriangleVertex& v2)
{
	const ClipFloat	degenerateLimit = (ClipFloat)1.0;

	// calc clip pos
	TriangleVertex	mid1;
	TriangleVertex	mid2;
	bool			outputDegenerate = false;

	{
		const TriangleVertex&	inside	= v1;
		const TriangleVertex&	outside	= clipped;
		      TriangleVertex&	middle	= mid1;

		const ClipFloat			hitDist	= plane.clipLineSegmentEnd(inside.position, outside.position);

		if (hitDist >= degenerateLimit)
		{
			// do not generate degenerate triangles
			outputDegenerate = true;
		}
		else
		{
			const ClipVec4 approximatedClipPoint	= tcu::mix(inside.position, outside.position, hitDist);
			const ClipVec4 anotherPointOnLine		= (hitDist > (ClipFloat)0.5) ? (inside.position) : (outside.position);

			middle.position = plane.getLineIntersectionPoint(approximatedClipPoint, anotherPointOnLine);
			middle.weight[0] = tcu::mix(inside.weight[0], outside.weight[0], hitDist);
			middle.weight[1] = tcu::mix(inside.weight[1], outside.weight[1], hitDist);
			middle.weight[2] = tcu::mix(inside.weight[2], outside.weight[2], hitDist);
		}
	}

	{
		const TriangleVertex&	inside	= v2;
		const TriangleVertex&	outside	= clipped;
		      TriangleVertex&	middle	= mid2;

		const ClipFloat			hitDist	= plane.clipLineSegmentEnd(inside.position, outside.position);

		if (hitDist >= degenerateLimit)
		{
			// do not generate degenerate triangles
			outputDegenerate = true;
		}
		else
		{
			const ClipVec4 approximatedClipPoint	= tcu::mix(inside.position, outside.position, hitDist);
			const ClipVec4 anotherPointOnLine		= (hitDist > (ClipFloat)0.5) ? (inside.position) : (outside.position);

			middle.position = plane.getLineIntersectionPoint(approximatedClipPoint, anotherPointOnLine);
			middle.weight[0] = tcu::mix(inside.weight[0], outside.weight[0], hitDist);
			middle.weight[1] = tcu::mix(inside.weight[1], outside.weight[1], hitDist);
			middle.weight[2] = tcu::mix(inside.weight[2], outside.weight[2], hitDist);
		}
	}

	if (!outputDegenerate)
	{
		// gen quad (v1) -> mid1 -> mid2 -> (v2)
		clippedEdges.push_back(v1);
		clippedEdges.push_back(mid1);
		clippedEdges.push_back(mid2);
		clippedEdges.push_back(v2);
	}
	else
	{
		// don't modify
		clippedEdges.push_back(v1);
		clippedEdges.push_back(clipped);
		clippedEdges.push_back(v2);
	}
}